

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O3

Builder * __thiscall
capnp::schema::Type::Builder::initList(Builder *__return_storage_ptr__,Builder *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  StructPointerCount SVar4;
  undefined2 uVar5;
  PointerBuilder local_28;
  
  *(undefined2 *)(this->_builder).data = 0xe;
  local_28.pointer = (this->_builder).pointers;
  local_28.segment = (this->_builder).segment;
  local_28.capTable = (this->_builder).capTable;
  capnp::_::PointerBuilder::clear(&local_28);
  SVar4 = (this->_builder).pointerCount;
  uVar5 = *(undefined2 *)&(this->_builder).field_0x26;
  (__return_storage_ptr__->_builder).dataSize = (this->_builder).dataSize;
  (__return_storage_ptr__->_builder).pointerCount = SVar4;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = uVar5;
  pSVar1 = (this->_builder).segment;
  pCVar2 = (this->_builder).capTable;
  pWVar3 = (this->_builder).pointers;
  (__return_storage_ptr__->_builder).data = (this->_builder).data;
  (__return_storage_ptr__->_builder).pointers = pWVar3;
  (__return_storage_ptr__->_builder).segment = pSVar1;
  (__return_storage_ptr__->_builder).capTable = pCVar2;
  return __return_storage_ptr__;
}

Assistant:

inline typename Type::List::Builder Type::Builder::initList() {
  _builder.setDataField<Type::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Type::LIST);
  _builder.getPointerField(::capnp::bounded<0>() * ::capnp::POINTERS).clear();
  return typename Type::List::Builder(_builder);
}